

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniSSC.cpp
# Opt level: O2

void * MiniSSCThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  double urt;
  double ult;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int local_8b8;
  CHRONO chrono_period;
  char szTemp [256];
  MINISSC minissc;
  char szSaveFilePath [256];
  
  memset(&minissc,0,0x618);
  StartChrono(&chrono_period);
  iVar10 = 0x32;
  bVar2 = false;
  local_8b8 = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      mSleep((long)iVar10);
      if (bPauseMiniSSC == 0) break;
      if (!bVar2) {
        puts("MiniSSC paused.");
        DisconnectMiniSSC(&minissc);
      }
      if (bExit != 0) goto LAB_0018583e;
      mSleep(100);
      bVar2 = true;
    }
    if (bRestartMiniSSC == 0) {
      if (bVar2) goto LAB_0018563d;
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      ult = u2;
      urt = u1;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      iVar8 = SetThrustersMiniSSC(&minissc,urt,ult);
      if (iVar8 != 0) {
        puts("Connection to a MiniSSC lost.");
        DisconnectMiniSSC(&minissc);
        goto LAB_0018565a;
      }
      bVar3 = false;
      bVar2 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting a MiniSSC.");
        DisconnectMiniSSC(&minissc);
      }
      bRestartMiniSSC = 0;
LAB_0018563d:
      iVar5 = ConnectMiniSSC(&minissc,"MiniSSC0.txt");
      iVar8 = minissc.threadperiod;
      if (iVar5 == 0) {
        if (minissc.pfSaveFile != (FILE *)0x0) {
          fclose((FILE *)minissc.pfSaveFile);
          minissc.pfSaveFile = (FILE *)0x0;
        }
        iVar10 = iVar8;
        if (minissc.bSaveRawData == 0) {
          bVar3 = false;
          bVar2 = true;
        }
        else {
          if (minissc.szCfgFilePath[0] == '\0') {
            builtin_strncpy(szTemp,"minissc",8);
          }
          else {
            sprintf(szTemp,"%.127s",minissc.szCfgFilePath);
          }
          sVar6 = strlen(szTemp);
          iVar8 = (int)sVar6 + 1;
          uVar9 = sVar6 & 0xffffffff;
          do {
            if ((int)uVar9 < 1) goto LAB_001857ba;
            uVar1 = uVar9 - 1;
            iVar8 = iVar8 + -1;
            lVar4 = uVar9 - 1;
            uVar9 = uVar1;
          } while (szTemp[lVar4] != '.');
          if ((uVar1 != 0) && (iVar8 <= (int)sVar6)) {
            memset(szTemp + (uVar1 & 0xffffffff),0,sVar6 - (uVar1 & 0xffffffff));
          }
LAB_001857ba:
          pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
          pcVar7 = strtimeex_fns();
          bVar3 = false;
          sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar7);
          pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
          minissc.pfSaveFile = (FILE *)fopen(szSaveFilePath,"wb");
          bVar2 = true;
          if ((FILE *)minissc.pfSaveFile == (FILE *)0x0) {
            puts("Unable to create MiniSSC data file.");
            bVar3 = false;
            goto LAB_00185841;
          }
        }
      }
      else {
        mSleep(1000);
LAB_0018565a:
        local_8b8 = local_8b8 + 1;
        if (ExitOnErrorCount <= local_8b8 && 0 < ExitOnErrorCount) {
          bExit = 1;
LAB_0018583e:
          bVar3 = true;
          goto LAB_00185841;
        }
        bVar2 = false;
        bVar3 = true;
      }
    }
    if (bExit != 0) {
LAB_00185841:
      SetThrustersMiniSSC(&minissc,0.0,0.0);
      mSleep(0x32);
      StopChronoQuick(&chrono_period);
      if (minissc.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)minissc.pfSaveFile);
        minissc.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        DisconnectMiniSSC(&minissc);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MiniSSCThread(void* pParam)
{
	MINISSC minissc;
	//double rudder = 0, thrust = 0, flux = 0;
	double thrust1 = 0, thrust2 = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&minissc, 0, sizeof(MINISSC));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMiniSSC) 
		{
			if (bConnected)
			{
				printf("MiniSSC paused.\n");
				bConnected = FALSE;
				DisconnectMiniSSC(&minissc);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMiniSSC) 
		{
			if (bConnected)
			{
				printf("Restarting a MiniSSC.\n");
				bConnected = FALSE;
				DisconnectMiniSSC(&minissc);
			}
			bRestartMiniSSC = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMiniSSC(&minissc, "MiniSSC0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = minissc.threadperiod;

				if (minissc.pfSaveFile != NULL)
				{
					fclose(minissc.pfSaveFile); 
					minissc.pfSaveFile = NULL;
				}
				if ((minissc.bSaveRawData)&&(minissc.pfSaveFile == NULL)) 
				{
					if (strlen(minissc.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", minissc.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "minissc");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					minissc.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (minissc.pfSaveFile == NULL) 
					{
						printf("Unable to create MiniSSC data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case BUBBLE_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetThrustersMiniSSC(&minissc, thrust1, thrust2) != EXIT_SUCCESS)
				{
					printf("Connection to a MiniSSC lost.\n");
					bConnected = FALSE;
					DisconnectMiniSSC(&minissc);
					break;
				}
				break;
			}
		}

		//printf("MiniSSCThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUBBLE_ROBID:
	default:
		SetThrustersMiniSSC(&minissc, 0, 0);
		mSleep(50);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (minissc.pfSaveFile != NULL)
	{
		fclose(minissc.pfSaveFile); 
		minissc.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMiniSSC(&minissc);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}